

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O2

void __thiscall
GoniometricLight_Power_Test::~GoniometricLight_Power_Test(GoniometricLight_Power_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GoniometricLight, Power) {
    Image image = MakeLightImage({512, 256});
    image = image.SelectChannels(image.GetChannelDesc({"R"}));

    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
    static ConstantSpectrum I(10.);
    Transform id;
    GoniometricLight light(id, MediumInterface(), &I, 1.f, std::move(image),
                           RGBColorSpace::sRGB, Allocator());

    SampledSpectrum phi = light.Phi(lambda);

    int sqrtSamples = 1024;
    int nSamples = sqrtSamples * sqrtSamples;
    double phiSampled = 0;
    for (Point2f u : Hammersley2D(nSamples)) {
        Vector3f w = SampleUniformSphere(u);
        phiSampled += light.Scale(w, lambda)[0];
    }
    phiSampled /= (nSamples * UniformSpherePDF());

    EXPECT_LT(std::abs(phiSampled - phi[0]), 1e-3)
        << " qmc: " << phiSampled << ", closed-form: " << phi[0];
}